

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,Reader *other)

{
  undefined4 uVar1;
  long lVar2;
  
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    (*(code *)((other->field_1).structValue.reader.segment)->arena[4]._vptr_Arena)(&this->field_1);
    (this->field_1).listValue.reader.segment = (other->field_1).listValue.reader.segment;
  }
  else {
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      uVar1 = *(undefined4 *)&other->field_0x4;
      this->type = other->type;
      *(undefined4 *)&this->field_0x4 = uVar1;
      other = (Reader *)&other->field_1;
      this = (Reader *)&this->field_1;
    }
  }
  return;
}

Assistant:

DynamicValue::Reader::Reader(const Reader& other) {
  switch (other.type) {
    case UNKNOWN:
    case VOID:
    case BOOL:
    case INT:
    case UINT:
    case FLOAT:
    case TEXT:
    case DATA:
    case LIST:
    case ENUM:
    case STRUCT:
    case ANY_POINTER:
      KJ_ASSERT_CAN_MEMCPY(Text::Reader);
      KJ_ASSERT_CAN_MEMCPY(Data::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicList::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicEnum);
      KJ_ASSERT_CAN_MEMCPY(DynamicStruct::Reader);
      KJ_ASSERT_CAN_MEMCPY(AnyPointer::Reader);
      break;

    case CAPABILITY:
      type = CAPABILITY;
      kj::ctor(capabilityValue, other.capabilityValue);
      return;
  }

  memcpy(this, &other, sizeof(*this));
}